

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,wchar_t *s,
          basic_format_specs<wchar_t> *specs,locale_ref param_4)

{
  basic_format_specs<wchar_t> *pbVar1;
  locale_ref out_00;
  bool bVar2;
  uintptr_t value;
  locale_ref in_R9;
  basic_string_view<wchar_t> s_00;
  locale_ref local_68;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_60;
  wchar_t *local_58;
  detail *local_50;
  error_handler local_41;
  basic_format_specs<wchar_t> *local_40;
  basic_format_specs<wchar_t> *specs_local;
  wchar_t *s_local;
  locale_ref param_3_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  local_40 = specs;
  specs_local = (basic_format_specs<wchar_t> *)s;
  s_local = (wchar_t *)param_4.locale_;
  param_3_local.locale_ = out.container;
  bVar2 = check_cstring_type_spec<fmt::v8::detail::error_handler>(specs->type,&local_41);
  out_00.locale_ = param_3_local.locale_;
  if (bVar2) {
    local_50 = (detail *)param_3_local.locale_;
    local_60.container = (buffer<wchar_t> *)specs_local;
    local_58 = (wchar_t *)std::char_traits<wchar_t>::length(&specs_local->width);
    pbVar1 = local_40;
    locale_ref::locale_ref(&local_68);
    s_00.size_ = (size_t)pbVar1;
    s_00.data_ = local_58;
    out_local = write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                          (local_50,local_60,s_00,(basic_format_specs<wchar_t> *)local_68.locale_,
                           in_R9);
  }
  else {
    value = to_uintptr(specs_local);
    out_local = write_ptr<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long>
                          ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_00.locale_,
                           value,local_40);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, const Char* s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  return check_cstring_type_spec(specs.type)
             ? write(out, basic_string_view<Char>(s), specs, {})
             : write_ptr<Char>(out, to_uintptr(s), &specs);
}